

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fAndroidExtensionPackES31ATests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::SubExtensionCase::iterate(SubExtensionCase *this)

{
  ostringstream *poVar1;
  bool bVar2;
  char *description;
  TestContext *this_00;
  undefined1 local_190 [120];
  ios_base local_118 [264];
  
  local_190._0_8_ =
       ((this->super_ExtensionPackTestCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
       ->m_log;
  poVar1 = (ostringstream *)(local_190 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Verifying that extension \"",0x1a);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,(this->m_extension)._M_dataplus._M_p,
             (this->m_extension)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\" is supported.",0xf);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_118);
  bVar2 = glu::ContextInfo::isExtensionSupported
                    (((this->super_ExtensionPackTestCase).super_TestCase.m_context)->m_contextInfo,
                     (this->m_extension)._M_dataplus._M_p);
  if (!bVar2) {
    local_190._0_8_ =
         ((this->super_ExtensionPackTestCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
         )->m_log;
    poVar1 = (ostringstream *)(local_190 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Error, extension is not supported.",0x22);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_118);
    this_00 = (this->super_ExtensionPackTestCase).super_TestCase.super_TestCase.super_TestNode.
              m_testCtx;
    description = "Required extension not supported";
  }
  else {
    local_190._0_8_ =
         ((this->super_ExtensionPackTestCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
         )->m_log;
    poVar1 = (ostringstream *)(local_190 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Extension is supported.",0x17);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_118);
    this_00 = (this->super_ExtensionPackTestCase).super_TestCase.super_TestCase.super_TestNode.
              m_testCtx;
    description = "Pass";
  }
  tcu::TestContext::setTestResult(this_00,(uint)!bVar2,description);
  return STOP;
}

Assistant:

SubExtensionCase::IterateResult SubExtensionCase::iterate (void)
{
	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Verifying that extension \"" << m_extension << "\" is supported."
		<< tcu::TestLog::EndMessage;

	if (m_context.getContextInfo().isExtensionSupported(m_extension.c_str()))
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Extension is supported."
			<< tcu::TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Error, extension is not supported."
			<< tcu::TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Required extension not supported");
	}

	return STOP;
}